

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMutex.h
# Opt level: O2

void __thiscall liblogger::LogMutex::Lock(LogMutex *this)

{
  LogException *this_00;
  int iVar1;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (-1 < iVar1) {
    return;
  }
  this_00 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"pthread_mutex_lock failed",&local_39);
  LogException::LogException(this_00,&local_38);
  __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void Lock() {
				if (pthread_mutex_lock(&m_mutex) < 0)
					throw(LogException("pthread_mutex_lock failed"));
			}